

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::full_formatter::format
          (full_formatter *this,log_msg *msg,tm *tm_time,memory_buf_t *dest)

{
  memory_buf_t *dest_00;
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *buf_ptr_2;
  char local_39;
  long local_38;
  
  lVar1 = (msg->time).__d.__r / 1000000000;
  sVar4 = (this->cached_datetime_).super_buffer<char>.size_;
  if (sVar4 == 0 || (this->cache_timestamp_).__r != lVar1) {
    (this->cached_datetime_).super_buffer<char>.size_ = 0;
    dest_00 = &this->cached_datetime_;
    local_39 = '[';
    local_38 = lVar1;
    fmt::v7::detail::buffer<char>::push_back(&dest_00->super_buffer<char>,&local_39);
    fmt_helper::append_int<int>(tm_time->tm_year + 0x76c,dest_00);
    local_39 = '-';
    fmt::v7::detail::buffer<char>::push_back(&dest_00->super_buffer<char>,&local_39);
    fmt_helper::pad2(tm_time->tm_mon + 1,dest_00);
    local_39 = '-';
    fmt::v7::detail::buffer<char>::push_back(&dest_00->super_buffer<char>,&local_39);
    fmt_helper::pad2(tm_time->tm_mday,dest_00);
    local_39 = ' ';
    fmt::v7::detail::buffer<char>::push_back(&dest_00->super_buffer<char>,&local_39);
    fmt_helper::pad2(tm_time->tm_hour,dest_00);
    local_39 = ':';
    fmt::v7::detail::buffer<char>::push_back(&dest_00->super_buffer<char>,&local_39);
    fmt_helper::pad2(tm_time->tm_min,dest_00);
    local_39 = ':';
    fmt::v7::detail::buffer<char>::push_back(&dest_00->super_buffer<char>,&local_39);
    fmt_helper::pad2(tm_time->tm_sec,dest_00);
    local_39 = '.';
    fmt::v7::detail::buffer<char>::push_back(&dest_00->super_buffer<char>,&local_39);
    (this->cache_timestamp_).__r = local_38;
    sVar4 = (this->cached_datetime_).super_buffer<char>.size_;
  }
  pcVar2 = (this->cached_datetime_).super_buffer<char>.ptr_;
  fmt::v7::detail::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar2,pcVar2 + sVar4);
  lVar1 = (msg->time).__d.__r;
  fmt_helper::pad3<unsigned_int>((int)(lVar1 / 1000000000) * -1000 + (int)(lVar1 / 1000000),dest);
  local_39 = ']';
  fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
  local_39 = ' ';
  fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
  if ((msg->logger_name).size_ != 0) {
    local_39 = '[';
    fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
    pcVar2 = (msg->logger_name).data_;
    fmt::v7::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,pcVar2,pcVar2 + (msg->logger_name).size_);
    local_39 = ']';
    fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
    local_39 = ' ';
    fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
  }
  local_39 = '[';
  fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
  msg->color_range_start = (dest->super_buffer<char>).size_;
  lVar1 = (ulong)msg->level * 0x10;
  fmt::v7::detail::buffer<char>::append<char>
            (&dest->super_buffer<char>,*(char **)(level::level_string_views + lVar1),
             *(char **)(level::level_string_views + lVar1) +
             *(long *)(level::level_string_views + lVar1 + 8));
  msg->color_range_end = (dest->super_buffer<char>).size_;
  local_39 = ']';
  fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
  local_39 = ' ';
  fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
  if ((msg->source).line != 0) {
    local_39 = '[';
    fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
    pcVar2 = short_filename_formatter<spdlog::details::null_scoped_padder>::basename
                       ((msg->source).filename);
    sVar3 = strlen(pcVar2);
    fmt::v7::detail::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar2,pcVar2 + sVar3);
    local_39 = ':';
    fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
    fmt_helper::append_int<int>((msg->source).line,dest);
    local_39 = ']';
    fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
    local_39 = ' ';
    fmt::v7::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_39);
  }
  pcVar2 = (msg->payload).data_;
  fmt::v7::detail::buffer<char>::append<char>
            (&dest->super_buffer<char>,pcVar2,pcVar2 + (msg->payload).size_);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override
    {
        using std::chrono::duration_cast;
        using std::chrono::milliseconds;
        using std::chrono::seconds;

        // cache the date/time part for the next second.
        auto duration = msg.time.time_since_epoch();
        auto secs = duration_cast<seconds>(duration);

        if (cache_timestamp_ != secs || cached_datetime_.size() == 0)
        {
            cached_datetime_.clear();
            cached_datetime_.push_back('[');
            fmt_helper::append_int(tm_time.tm_year + 1900, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mon + 1, cached_datetime_);
            cached_datetime_.push_back('-');

            fmt_helper::pad2(tm_time.tm_mday, cached_datetime_);
            cached_datetime_.push_back(' ');

            fmt_helper::pad2(tm_time.tm_hour, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_min, cached_datetime_);
            cached_datetime_.push_back(':');

            fmt_helper::pad2(tm_time.tm_sec, cached_datetime_);
            cached_datetime_.push_back('.');

            cache_timestamp_ = secs;
        }
        dest.append(cached_datetime_.begin(), cached_datetime_.end());

        auto millis = fmt_helper::time_fraction<milliseconds>(msg.time);
        fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
        dest.push_back(']');
        dest.push_back(' ');

        // append logger name if exists
        if (msg.logger_name.size() > 0)
        {
            dest.push_back('[');
            fmt_helper::append_string_view(msg.logger_name, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }

        dest.push_back('[');
        // wrap the level name with color
        msg.color_range_start = dest.size();
        // fmt_helper::append_string_view(level::to_c_str(msg.level), dest);
        fmt_helper::append_string_view(level::to_string_view(msg.level), dest);
        msg.color_range_end = dest.size();
        dest.push_back(']');
        dest.push_back(' ');

        // add source location if present
        if (!msg.source.empty())
        {
            dest.push_back('[');
            const char *filename = details::short_filename_formatter<details::null_scoped_padder>::basename(msg.source.filename);
            fmt_helper::append_string_view(filename, dest);
            dest.push_back(':');
            fmt_helper::append_int(msg.source.line, dest);
            dest.push_back(']');
            dest.push_back(' ');
        }
        // fmt_helper::append_string_view(msg.msg(), dest);
        fmt_helper::append_string_view(msg.payload, dest);
    }